

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O0

void __thiscall cxxpool::thread_pool::clear(thread_pool *this)

{
  undefined1 local_38 [8];
  priority_queue<cxxpool::detail::priority_task,_std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>,_std::less<cxxpool::detail::priority_task>_>
  empty;
  lock_guard<std::mutex> task_lock;
  thread_pool *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&empty.field_0x18,&this->task_mutex_);
  std::
  priority_queue<cxxpool::detail::priority_task,std::vector<cxxpool::detail::priority_task,std::allocator<cxxpool::detail::priority_task>>,std::less<cxxpool::detail::priority_task>>
  ::
  priority_queue<std::vector<cxxpool::detail::priority_task,std::allocator<cxxpool::detail::priority_task>>,void>
            ((priority_queue<cxxpool::detail::priority_task,std::vector<cxxpool::detail::priority_task,std::allocator<cxxpool::detail::priority_task>>,std::less<cxxpool::detail::priority_task>>
              *)local_38);
  std::
  priority_queue<cxxpool::detail::priority_task,_std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>,_std::less<cxxpool::detail::priority_task>_>
  ::swap(&this->tasks_,
         (priority_queue<cxxpool::detail::priority_task,_std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>,_std::less<cxxpool::detail::priority_task>_>
          *)local_38);
  std::
  priority_queue<cxxpool::detail::priority_task,_std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>,_std::less<cxxpool::detail::priority_task>_>
  ::~priority_queue((priority_queue<cxxpool::detail::priority_task,_std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>,_std::less<cxxpool::detail::priority_task>_>
                     *)local_38);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&empty.field_0x18);
  return;
}

Assistant:

void clear() {
        std::lock_guard<std::mutex> task_lock(task_mutex_);
        decltype(tasks_) empty;
        tasks_.swap(empty);
    }